

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O3

int require_comma(Context_conflict *ctx)

{
  Token TVar1;
  int extraout_EAX;
  
  TVar1 = nexttoken(ctx);
  if (TVar1 == 0x2c) {
    return 0x2c;
  }
  failf(ctx,"%s","Comma expected");
  return extraout_EAX;
}

Assistant:

static int require_comma(Context *ctx)
{
    const Token token = nexttoken(ctx);
    if (token != ((Token) ','))
    {
        fail(ctx, "Comma expected");
        return 0;
    } // if
    return 1;
}